

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_copyCCtx_internal
                 (ZSTD_CCtx *dstCCtx,ZSTD_CCtx *srcCCtx,ZSTD_frameParameters fParams,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  int *in_RSI;
  long in_RDI;
  ZSTD_matchState_t *dstMatchState;
  ZSTD_matchState_t *srcMatchState;
  size_t tableSpace;
  size_t h3Size;
  size_t hSize;
  size_t chainSize;
  ZSTD_CCtx_params params;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  long local_100;
  undefined1 *local_f8;
  undefined8 *local_f0;
  int *local_e8;
  size_t local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  undefined4 local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  int iStack_a4;
  undefined8 local_a0;
  undefined4 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  int *local_38;
  long local_30;
  undefined8 local_14;
  undefined4 local_c;
  size_t local_8;
  
  if (*in_RSI == 1) {
    *(undefined8 *)(in_RDI + 400) = *(undefined8 *)(in_RSI + 100);
    *(undefined8 *)(in_RDI + 0x198) = *(undefined8 *)(in_RSI + 0x66);
    *(undefined8 *)(in_RDI + 0x1a0) = *(undefined8 *)(in_RSI + 0x68);
    local_38 = in_RSI;
    local_30 = in_RDI;
    local_14 = in_RDX;
    local_c = in_ECX;
    memcpy(&local_c0,(void *)(in_RDI + 0x10),0x78);
    uStack_bc = (undefined4)*(undefined8 *)(local_38 + 0x23);
    uStack_b8 = (undefined4)((ulong)*(undefined8 *)(local_38 + 0x23) >> 0x20);
    uStack_b4 = (undefined4)*(undefined8 *)(local_38 + 0x25);
    uStack_b0 = (undefined4)((ulong)*(undefined8 *)(local_38 + 0x25) >> 0x20);
    uStack_ac = (undefined4)*(undefined8 *)(local_38 + 0x27);
    uStack_a8 = (undefined4)((ulong)*(undefined8 *)(local_38 + 0x27) >> 0x20);
    iStack_a4 = local_38[0x29];
    local_a0 = local_14;
    uStack_98 = local_c;
    local_108 = local_50;
    local_118 = local_60;
    uStack_110 = uStack_58;
    local_128 = local_70;
    uStack_120 = uStack_68;
    local_138 = local_80;
    uStack_130 = uStack_78;
    local_178 = CONCAT44(uStack_bc,local_c0);
    uStack_170 = CONCAT44(uStack_b4,uStack_b8);
    local_168 = CONCAT44(uStack_ac,uStack_b0);
    uStack_160 = CONCAT44(iStack_a4,uStack_a8);
    local_148 = local_90;
    uStack_140 = uStack_88;
    local_158 = local_14;
    local_f8 = (undefined1 *)&local_178;
    ZSTD_resetCCtx_internal
              ((ZSTD_CCtx *)tableSpace,_chainSize,(U64)srcMatchState,dstMatchState._4_4_,
               (ZSTD_buffered_policy_e)dstMatchState);
    if (local_38[0x29] == 1) {
      local_100 = 0;
    }
    else {
      local_100 = 1L << ((byte)local_38[0x24] & 0x3f);
    }
    local_c8 = local_100;
    local_d0 = 1L << ((byte)local_38[0x25] & 0x3f);
    local_d8 = 1L << ((byte)local_38[0xa5] & 0x3f);
    local_e0 = (local_100 + local_d0 + local_d8) * 4;
    memcpy(*(void **)(local_30 + 0x298),*(void **)(local_38 + 0xa6),local_e0);
    local_e8 = local_38 + 0x9a;
    local_f0 = (undefined8 *)(local_30 + 0x268);
    *local_f0 = *(undefined8 *)local_e8;
    *(undefined8 *)(local_30 + 0x270) = *(undefined8 *)(local_38 + 0x9c);
    *(undefined8 *)(local_30 + 0x278) = *(undefined8 *)(local_38 + 0x9e);
    *(undefined8 *)(local_30 + 0x280) = *(undefined8 *)(local_38 + 0xa0);
    *(int *)(local_30 + 0x28c) = local_38[0xa3];
    *(int *)(local_30 + 0x290) = local_38[0xa4];
    *(int *)(local_30 + 0x288) = local_38[0xa2];
    *(int *)(local_30 + 0x100) = local_38[0x40];
    memcpy(*(void **)(local_30 + 600),*(void **)(local_38 + 0x96),0x11f0);
    local_8 = 0;
  }
  else {
    local_8 = 0xffffffffffffffc4;
  }
  return local_8;
}

Assistant:

static size_t ZSTD_copyCCtx_internal(ZSTD_CCtx* dstCCtx,
                            const ZSTD_CCtx* srcCCtx,
                            ZSTD_frameParameters fParams,
                            U64 pledgedSrcSize,
                            ZSTD_buffered_policy_e zbuff)
{
    DEBUGLOG(5, "ZSTD_copyCCtx_internal");
    if (srcCCtx->stage!=ZSTDcs_init) return ERROR(stage_wrong);

    memcpy(&dstCCtx->customMem, &srcCCtx->customMem, sizeof(ZSTD_customMem));
    {   ZSTD_CCtx_params params = dstCCtx->requestedParams;
        /* Copy only compression parameters related to tables. */
        params.cParams = srcCCtx->appliedParams.cParams;
        params.fParams = fParams;
        ZSTD_resetCCtx_internal(dstCCtx, params, pledgedSrcSize,
                                ZSTDcrp_noMemset, zbuff);
        assert(dstCCtx->appliedParams.cParams.windowLog == srcCCtx->appliedParams.cParams.windowLog);
        assert(dstCCtx->appliedParams.cParams.strategy == srcCCtx->appliedParams.cParams.strategy);
        assert(dstCCtx->appliedParams.cParams.hashLog == srcCCtx->appliedParams.cParams.hashLog);
        assert(dstCCtx->appliedParams.cParams.chainLog == srcCCtx->appliedParams.cParams.chainLog);
        assert(dstCCtx->blockState.matchState.hashLog3 == srcCCtx->blockState.matchState.hashLog3);
    }

    /* copy tables */
    {   size_t const chainSize = (srcCCtx->appliedParams.cParams.strategy == ZSTD_fast) ? 0 : ((size_t)1 << srcCCtx->appliedParams.cParams.chainLog);
        size_t const hSize =  (size_t)1 << srcCCtx->appliedParams.cParams.hashLog;
        size_t const h3Size = (size_t)1 << srcCCtx->blockState.matchState.hashLog3;
        size_t const tableSpace = (chainSize + hSize + h3Size) * sizeof(U32);
        assert((U32*)dstCCtx->blockState.matchState.chainTable == (U32*)dstCCtx->blockState.matchState.hashTable + hSize);  /* chainTable must follow hashTable */
        assert((U32*)dstCCtx->blockState.matchState.hashTable3 == (U32*)dstCCtx->blockState.matchState.chainTable + chainSize);
        memcpy(dstCCtx->blockState.matchState.hashTable, srcCCtx->blockState.matchState.hashTable, tableSpace);   /* presumes all tables follow each other */
    }

    /* copy dictionary offsets */
    {
        const ZSTD_matchState_t* srcMatchState = &srcCCtx->blockState.matchState;
        ZSTD_matchState_t* dstMatchState = &dstCCtx->blockState.matchState;
        dstMatchState->window       = srcMatchState->window;
        dstMatchState->nextToUpdate = srcMatchState->nextToUpdate;
        dstMatchState->nextToUpdate3= srcMatchState->nextToUpdate3;
        dstMatchState->loadedDictEnd= srcMatchState->loadedDictEnd;
    }
    dstCCtx->dictID = srcCCtx->dictID;

    /* copy block state */
    memcpy(dstCCtx->blockState.prevCBlock, srcCCtx->blockState.prevCBlock, sizeof(*srcCCtx->blockState.prevCBlock));

    return 0;
}